

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
TestFailure::TestFailure(TestFailure *this,UtestShell *test,SimpleString *theMessage)

{
  size_t sVar1;
  
  this->_vptr_TestFailure = (_func_int **)&PTR__TestFailure_001647b8;
  (*test->_vptr_UtestShell[5])();
  UtestShell::getName((UtestShell *)&this->testNameOnly_);
  UtestShell::getFile((UtestShell *)&this->fileName_);
  sVar1 = UtestShell::getLineNumber(test);
  this->lineNumber_ = sVar1;
  UtestShell::getFile((UtestShell *)&this->testFileName_);
  sVar1 = UtestShell::getLineNumber(test);
  this->testLineNumber_ = sVar1;
  SimpleString::SimpleString(&this->message_,theMessage);
  return;
}

Assistant:

TestFailure::TestFailure(UtestShell* test, const SimpleString& theMessage) :
    testName_(test->getFormattedName()), testNameOnly_(test->getName()), fileName_(test->getFile()), lineNumber_(test->getLineNumber()), testFileName_(test->getFile()), testLineNumber_(test->getLineNumber()), message_(theMessage)
{
}